

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O2

void ts_subtree__print_dot_graph
               (Subtree *self,uint32_t start_offset,TSLanguage *language,TSSymbol alias_symbol,
               FILE *f)

{
  Subtree *self_00;
  char cVar1;
  SubtreeHeapData *pSVar2;
  Subtree *pSVar3;
  _Bool _Var4;
  ushort uVar5;
  uint32_t uVar6;
  ulong uVar7;
  TSSymbol TVar8;
  char *__s;
  uint32_t i;
  uint uVar9;
  Subtree SVar10;
  ulong uVar11;
  char *c;
  char *pcVar12;
  long lVar13;
  Length LVar14;
  TSSymbol *local_58;
  uint32_t n;
  
  SVar10 = (Subtree)self->ptr;
  if (((ulong)SVar10.ptr & 1) == 0) {
    TVar8 = (SVar10.ptr)->symbol;
  }
  else {
    TVar8 = (TSSymbol)SVar10.data.symbol;
  }
  if (alias_symbol == 0) {
    alias_symbol = TVar8;
  }
  LVar14 = ts_subtree_total_size(SVar10);
  fprintf((FILE *)f,"tree_%p [label=\"",self);
  if (alias_symbol == 0xffff) {
    pcVar12 = "ERROR";
  }
  else if (alias_symbol == 0xfffe) {
    pcVar12 = "_ERROR";
  }
  else {
    pcVar12 = language->symbol_names[alias_symbol];
  }
  do {
    cVar1 = *pcVar12;
    if (cVar1 == '\n') {
      __s = "\\n";
LAB_0011a380:
      fputs(__s,(FILE *)f);
    }
    else {
      if (cVar1 == '\"') {
        __s = "\\\"";
        goto LAB_0011a380;
      }
      if (cVar1 == '\0') {
        fputc(0x22,(FILE *)f);
        SVar10 = (Subtree)self->ptr;
        if ((((ulong)SVar10.ptr & 1) != 0) || ((SVar10.ptr)->child_count == 0)) {
          fwrite(", shape=plaintext",0x11,1,(FILE *)f);
          SVar10 = (Subtree)self->ptr;
        }
        _Var4 = ts_subtree_extra(SVar10);
        if (_Var4) {
          fwrite(", fontcolor=gray",0x10,1,(FILE *)f);
          SVar10 = (Subtree)self->ptr;
        }
        if (((ulong)SVar10.ptr & 1) == 0) {
          uVar5 = (SVar10.ptr)->parse_state;
        }
        else {
          uVar5 = SVar10.data.parse_state;
        }
        uVar6 = ts_subtree_error_cost(SVar10);
        _Var4 = ts_subtree_has_changes(SVar10);
        if (((ulong)SVar10.ptr & 1) == 0) {
          if ((SVar10.ptr)->child_count == 0) {
            uVar7 = 0;
          }
          else {
            uVar7 = (ulong)((SVar10.ptr)->field_17).field_0.repeat_depth;
          }
          uVar9 = (SVar10.ptr)->lookahead_bytes;
        }
        else {
          uVar9 = SVar10._4_4_ >> 0xc & 0xf;
          uVar7 = 0;
        }
        fprintf((FILE *)f,
                ", tooltip=\"range: %u - %u\nstate: %d\nerror-cost: %u\nhas-changes: %u\nrepeat-depth: %u\nlookahead-bytes: %u\"]\n"
                ,(ulong)start_offset,(ulong)(LVar14.bytes + start_offset),(ulong)uVar5,(ulong)uVar6,
                (ulong)_Var4,uVar7,(ulong)uVar9);
        pSVar2 = self->ptr;
        local_58 = (TSSymbol *)0x0;
        _n = 0;
        if (((ulong)pSVar2 & 1) == 0) {
          _n = (ulong)pSVar2->child_count;
          if ((_n == 0) || (uVar7 = (ulong)(pSVar2->field_17).field_0.alias_sequence_id, uVar7 == 0)
             ) {
            local_58 = (TSSymbol *)0x0;
          }
          else {
            local_58 = language->alias_sequences + language->max_alias_sequence_length * uVar7;
          }
        }
        lVar13 = 0;
        uVar7 = 0;
        for (uVar11 = 0; _n != uVar11; uVar11 = uVar11 + 1) {
          pSVar3 = (self->ptr->field_17).field_0.children;
          self_00 = (Subtree *)((long)pSVar3 + lVar13);
          _Var4 = ts_subtree_extra(pSVar3[uVar11]);
          if (_Var4) {
            ts_subtree__print_dot_graph(self_00,start_offset,language,0,f);
          }
          else {
            if (local_58 == (TSSymbol *)0x0) {
              TVar8 = 0;
            }
            else {
              TVar8 = local_58[uVar7];
            }
            ts_subtree__print_dot_graph(self_00,start_offset,language,TVar8,f);
            uVar7 = (ulong)((int)uVar7 + 1);
          }
          fprintf((FILE *)f,"tree_%p -> tree_%p [tooltip=%u]\n",self,self_00,uVar11 & 0xffffffff);
          LVar14 = ts_subtree_total_size(pSVar3[uVar11]);
          start_offset = start_offset + LVar14.bytes;
          lVar13 = lVar13 + 8;
        }
        return;
      }
      fputc((int)cVar1,(FILE *)f);
    }
    pcVar12 = pcVar12 + 1;
  } while( true );
}

Assistant:

void ts_subtree__print_dot_graph(const Subtree *self, uint32_t start_offset,
                                 const TSLanguage *language, TSSymbol alias_symbol,
                                 FILE *f) {
  TSSymbol subtree_symbol = ts_subtree_symbol(*self);
  TSSymbol symbol = alias_symbol ? alias_symbol : subtree_symbol;
  uint32_t end_offset = start_offset + ts_subtree_total_bytes(*self);
  fprintf(f, "tree_%p [label=\"", self);
  ts_subtree__write_dot_string(f, ts_language_symbol_name(language, symbol));
  fprintf(f, "\"");

  if (ts_subtree_child_count(*self) == 0) fprintf(f, ", shape=plaintext");
  if (ts_subtree_extra(*self)) fprintf(f, ", fontcolor=gray");

  fprintf(f, ", tooltip=\""
    "range: %u - %u\n"
    "state: %d\n"
    "error-cost: %u\n"
    "has-changes: %u\n"
    "repeat-depth: %u\n"
    "lookahead-bytes: %u\"]\n",
    start_offset, end_offset,
    ts_subtree_parse_state(*self),
    ts_subtree_error_cost(*self),
    ts_subtree_has_changes(*self),
    ts_subtree_repeat_depth(*self),
    ts_subtree_lookahead_bytes(*self)
  );

  uint32_t child_start_offset = start_offset;
  uint32_t structural_child_index = 0;
  const TSSymbol *alias_sequence = ts_language_alias_sequence(
    language,
    ts_subtree_alias_sequence_id(*self)
  );
  for (uint32_t i = 0, n = ts_subtree_child_count(*self); i < n; i++) {
    const Subtree *child = &self->ptr->children[i];
    if (ts_subtree_extra(*child)) {
      ts_subtree__print_dot_graph(child, child_start_offset, language, 0, f);
    } else {
      TSSymbol alias_symbol = alias_sequence ? alias_sequence[structural_child_index] : 0;
      ts_subtree__print_dot_graph(child, child_start_offset, language, alias_symbol, f);
      structural_child_index++;
    }
    fprintf(f, "tree_%p -> tree_%p [tooltip=%u]\n", self, child, i);
    child_start_offset += ts_subtree_total_bytes(*child);
  }
}